

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
HdlcSimulationDataGenerator::TransmitBitSync
          (HdlcSimulationDataGenerator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  pointer puVar1;
  bool bVar2;
  BitState bitState;
  uint uVar3;
  BitState BVar4;
  int iVar5;
  char cVar6;
  bool bVar7;
  BitExtractor bit_extractor;
  
  CreateFlagBitSeq(this);
  bVar2 = ContainsElement(this,this->mFrameNumber);
  uVar3 = 0;
  BVar4 = BIT_LOW;
  cVar6 = '\0';
  while( true ) {
    puVar1 = (stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= (ulong)uVar3) {
      CreateFlagBitSeq(this);
      return;
    }
    if (this->mAbortByte == uVar3 && bVar2) break;
    iVar5 = 8;
    BitExtractor::BitExtractor(&bit_extractor,(ulong)puVar1[uVar3],LsbFirst,8);
    while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
      bitState = BitExtractor::GetNextBit();
      CreateSyncBit(this,bitState);
      cVar6 = cVar6 + '\x01';
      if (BVar4 != BIT_HIGH || bitState != BIT_HIGH) {
        cVar6 = '\0';
      }
      BVar4 = bitState;
      if (cVar6 == '\x04') {
        BVar4 = BIT_LOW;
        CreateSyncBit(this,BIT_LOW);
        cVar6 = '\0';
      }
    }
    BitExtractor::~BitExtractor(&bit_extractor);
    uVar3 = uVar3 + 1;
  }
  iVar5 = 7;
  while (bVar2 = iVar5 != 0, iVar5 = iVar5 + -1, bVar2) {
    CreateSyncBit(this,BIT_HIGH);
  }
  this->mAbortByte = this->mAbortByte + 1;
  return;
}

Assistant:

void HdlcSimulationDataGenerator::TransmitBitSync( const vector<U8>& stream )
{
    // Opening flag
    CreateFlagBitSeq();

    bool abortFrame = ContainsElement( mFrameNumber );

    U8 consecutiveOnes = 0;
    BitState previousBit = BIT_LOW;
    // For each byte of the stream
    U32 index = 0;
    for( U32 s = 0; s < stream.size(); ++s )
    {
        bool abortThisByte = ( mAbortByte == s );
        if( abortFrame && abortThisByte )
        {
            // Sync bit abort sequence = 7 or more consecutive 1
            for( U32 j = 0; j < 7; ++j )
            {
                CreateSyncBit( BIT_HIGH );
            }
            mAbortByte++;
            return;
        }

        // For each bit of the byte stream
        BitExtractor bit_extractor( stream[ s ], AnalyzerEnums::LsbFirst, 8 );
        for( U32 i = 0; i < 8; ++i )
        {
            BitState bit = bit_extractor.GetNextBit();
            CreateSyncBit( bit );

            if( bit == BIT_HIGH )
            {
                if( previousBit == BIT_HIGH )
                {
                    consecutiveOnes++;
                }
                else
                {
                    consecutiveOnes = 0;
                }
            }
            else // bit low
            {
                consecutiveOnes = 0;
            }

            if( consecutiveOnes == 4 ) // if five 1s in a row, then insert a 0 and continue
            {
                CreateSyncBit( BIT_LOW );
                consecutiveOnes = 0;
                previousBit = BIT_LOW;
            }
            else
            {
                previousBit = bit;
            }
            index++;
        }
    }

    // Closing flag
    CreateFlagBitSeq();
}